

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

int nk_do_button_text_symbol
              (nk_flags *state,nk_command_buffer *out,nk_rect bounds,nk_symbol_type symbol,char *str
              ,int len,nk_flags align,nk_button_behavior behavior,nk_style_button *style,
              nk_user_font *font,nk_input *in)

{
  uint state_00;
  nk_rect b;
  int iVar1;
  nk_style_item *pnVar2;
  long lVar3;
  nk_color *pnVar4;
  float fVar5;
  float fVar6;
  nk_rect content;
  nk_rect local_88;
  undefined8 local_78;
  undefined8 uStack_70;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  nk_rect local_50;
  nk_text local_40;
  
  local_50 = bounds;
  if (style == (nk_style_button *)0x0) {
    __assert_fail("style",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x4d2f,
                  "int nk_do_button_text_symbol(nk_flags *, struct nk_command_buffer *, struct nk_rect, enum nk_symbol_type, const char *, int, nk_flags, enum nk_button_behavior, const struct nk_style_button *, const struct nk_user_font *, const struct nk_input *)"
                 );
  }
  if (out != (nk_command_buffer *)0x0) {
    if (font != (nk_user_font *)0x0) {
      iVar1 = nk_do_button(state,out,bounds,style,in,behavior,&local_88);
      local_68 = font->height;
      if ((align & 1) == 0) {
        fVar6 = (style->padding).x;
        fVar6 = fVar6 + fVar6 + local_88.x;
      }
      else {
        fVar6 = (style->padding).x;
        fVar5 = (local_88.x + local_88.w) - (fVar6 + fVar6 + local_68);
        fVar6 = 0.0;
        if (0.0 <= fVar5) {
          fVar6 = fVar5;
        }
      }
      local_78 = CONCAT44((local_88.h * 0.5 + local_88.y) - local_68 * 0.5,fVar6);
      uStack_70 = 0;
      fStack_64 = local_68;
      fStack_60 = local_68;
      fStack_5c = local_68;
      if (style->draw_begin != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
        (*style->draw_begin)(out,(nk_handle)(style->userdata).ptr);
      }
      state_00 = *state;
      pnVar2 = nk_draw_button(out,&local_50,state_00,style);
      pnVar4 = &style->text_background;
      if (pnVar2->type == NK_STYLE_ITEM_COLOR) {
        pnVar4 = (nk_color *)&pnVar2->data;
      }
      local_40.background = *pnVar4;
      lVar3 = 0x6c;
      if ((state_00 & 0x10) == 0) {
        lVar3 = (ulong)((state_00 & 0x20) >> 2) + 0x68;
      }
      local_40.text = *(nk_color *)((long)&(style->normal).type + lVar3);
      local_40.padding.x = 0.0;
      local_40.padding.y = 0.0;
      content.h = fStack_64;
      content.w = local_68;
      content.x = (float)(undefined4)local_78;
      content.y = (float)local_78._4_4_;
      nk_draw_symbol(out,symbol,content,style->text_background,local_40.text,0.0,font);
      b.y = local_88.y;
      b.x = local_88.x;
      b.w = local_88.w;
      b.h = local_88.h;
      nk_widget_text(out,b,str,len,&local_40,0x12,font);
      if (style->draw_end != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
        (*style->draw_end)(out,(nk_handle)(style->userdata).ptr);
      }
      return iVar1;
    }
    __assert_fail("font",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x4d31,
                  "int nk_do_button_text_symbol(nk_flags *, struct nk_command_buffer *, struct nk_rect, enum nk_symbol_type, const char *, int, nk_flags, enum nk_button_behavior, const struct nk_style_button *, const struct nk_user_font *, const struct nk_input *)"
                 );
  }
  __assert_fail("out",
                "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                ,0x4d30,
                "int nk_do_button_text_symbol(nk_flags *, struct nk_command_buffer *, struct nk_rect, enum nk_symbol_type, const char *, int, nk_flags, enum nk_button_behavior, const struct nk_style_button *, const struct nk_user_font *, const struct nk_input *)"
               );
}

Assistant:

NK_LIB int
nk_do_button_text_symbol(nk_flags *state,
    struct nk_command_buffer *out, struct nk_rect bounds,
    enum nk_symbol_type symbol, const char *str, int len, nk_flags align,
    enum nk_button_behavior behavior, const struct nk_style_button *style,
    const struct nk_user_font *font, const struct nk_input *in)
{
    int ret;
    struct nk_rect tri = {0,0,0,0};
    struct nk_rect content;

    NK_ASSERT(style);
    NK_ASSERT(out);
    NK_ASSERT(font);
    if (!out || !style || !font)
        return nk_false;

    ret = nk_do_button(state, out, bounds, style, in, behavior, &content);
    tri.y = content.y + (content.h/2) - font->height/2;
    tri.w = font->height; tri.h = font->height;
    if (align & NK_TEXT_ALIGN_LEFT) {
        tri.x = (content.x + content.w) - (2 * style->padding.x + tri.w);
        tri.x = NK_MAX(tri.x, 0);
    } else tri.x = content.x + 2 * style->padding.x;

    /* draw button */
    if (style->draw_begin) style->draw_begin(out, style->userdata);
    nk_draw_button_text_symbol(out, &bounds, &content, &tri,
        *state, style, str, len, symbol, font);
    if (style->draw_end) style->draw_end(out, style->userdata);
    return ret;
}